

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O0

ostream * despot::operator<<(ostream *os,NamedVar *var)

{
  ostream *poVar1;
  size_type sVar2;
  const_reference pvVar3;
  int local_1c;
  int i;
  NamedVar *var_local;
  ostream *os_local;
  
  poVar1 = std::operator<<(os,"Name:");
  poVar1 = std::operator<<(poVar1,(string *)&var->name_);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<(os,"Values:");
  local_1c = 0;
  while( true ) {
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&(var->super_Variable).values_);
    if (sVar2 <= (ulong)(long)local_1c) break;
    poVar1 = std::operator<<(os," ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1c);
    poVar1 = std::operator<<(poVar1,"=");
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&(var->super_Variable).values_,(long)local_1c);
    std::operator<<(poVar1,(string *)pvVar3);
    local_1c = local_1c + 1;
  }
  return os;
}

Assistant:

ostream& operator<<(std::ostream& os, const NamedVar& var) {
	os << "Name:" << var.name_ << endl;
	os << "Values:";

	for (int i = 0; i < var.values_.size(); i++) {
		os << " " << i << "=" << var.values_[i];
	}
	return os;
}